

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_attention.h
# Opt level: O0

longlong __thiscall
shift_window_transformer::WindowAttention<float>::parameterCount(WindowAttention<float> *this)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_type sVar3;
  longlong lVar4;
  long local_18;
  longlong ret;
  WindowAttention<float> *this_local;
  
  local_18 = 0;
  if (this->cyclicShift != (CyclicShift<float> *)0x0) {
    local_18 = (**(code **)(*(long *)this->cyclicShift + 8))();
  }
  if (this->cyclicBackShift != (CyclicShift<float> *)0x0) {
    lVar2 = (**(code **)(*(long *)this->cyclicBackShift + 8))();
    local_18 = lVar2 + local_18;
  }
  if (this->qLinear != (Linear<float> *)0x0) {
    iVar1 = (*(this->qLinear->super_Layer<float>)._vptr_Layer[1])();
    local_18 = CONCAT44(extraout_var,iVar1) + local_18;
  }
  if (this->kLinear != (Linear<float> *)0x0) {
    iVar1 = (*(this->kLinear->super_Layer<float>)._vptr_Layer[1])();
    local_18 = CONCAT44(extraout_var_00,iVar1) + local_18;
  }
  if (this->vLinear != (Linear<float> *)0x0) {
    iVar1 = (*(this->vLinear->super_Layer<float>)._vptr_Layer[1])();
    local_18 = CONCAT44(extraout_var_01,iVar1) + local_18;
  }
  if (this->outLinear != (Linear<float> *)0x0) {
    iVar1 = (*(this->outLinear->super_Layer<float>)._vptr_Layer[1])();
    local_18 = CONCAT44(extraout_var_02,iVar1) + local_18;
  }
  if (this->upperLowerMask != (Tensor<float> *)0x0) {
    sVar3 = std::vector<float,_std::allocator<float>_>::size
                      (&this->upperLowerMask->super_vector<float,_std::allocator<float>_>);
    local_18 = sVar3 + local_18;
  }
  if (this->leftRightMask != (Tensor<float> *)0x0) {
    sVar3 = std::vector<float,_std::allocator<float>_>::size
                      (&this->leftRightMask->super_vector<float,_std::allocator<float>_>);
    local_18 = sVar3 + local_18;
  }
  if (this->relativeIndices != (Tensor<int> *)0x0) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      (&this->relativeIndices->super_vector<int,_std::allocator<int>_>);
    local_18 = sVar3 + local_18;
  }
  if (this->posEmbedding != (Tensor<float> *)0x0) {
    sVar3 = std::vector<float,_std::allocator<float>_>::size
                      (&this->posEmbedding->super_vector<float,_std::allocator<float>_>);
    local_18 = sVar3 + local_18;
  }
  lVar4 = SoftMax<float>::parameterCount(&this->softMax);
  return lVar4 + local_18;
}

Assistant:

long long parameterCount() {
            long long ret = 0;
            if (cyclicShift != nullptr) ret += cyclicShift->parameterCount();
            if (cyclicBackShift != nullptr) ret += cyclicBackShift->parameterCount();
            if (qLinear != nullptr) ret += qLinear->parameterCount();
            if (kLinear != nullptr) ret += kLinear->parameterCount();
            if (vLinear != nullptr) ret += vLinear->parameterCount();
            if (outLinear != nullptr) ret += outLinear->parameterCount();
            if (upperLowerMask != nullptr) ret += upperLowerMask->size();
            if (leftRightMask != nullptr) ret += leftRightMask->size();
            if (relativeIndices != nullptr) ret += relativeIndices->size();
            if (posEmbedding != nullptr) ret += posEmbedding->size();
            ret += softMax.parameterCount();
            return ret;
        }